

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tests.cpp
# Opt level: O2

void __thiscall merkle_tests::merkle_test_BlockWitness::test_method(merkle_test_BlockWitness *this)

{
  long lVar1;
  element_type *peVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  vector<uint256,_std::allocator<uint256>_> hashes_00;
  ulong uVar6;
  iterator in_R8;
  iterator in_R9;
  long lVar7;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  undefined8 in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  pointer in_stack_fffffffffffffe88;
  undefined **local_170;
  undefined1 local_168;
  undefined1 *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  _Vector_base<uint256,_std::allocator<uint256>_> local_130;
  vector<uint256,_std::allocator<uint256>_> hashes;
  uint256 merkleRootofHashes;
  uint256 blockWitness;
  CBlock block;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CBlock::CBlock(&block);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::resize(&block.vtx,2);
  lVar7 = 0;
  for (uVar6 = 0;
      uVar6 < (ulong)((long)block.vtx.
                            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)block.vtx.
                            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4); uVar6 = uVar6 + 1) {
    CMutableTransaction::CMutableTransaction((CMutableTransaction *)&blockWitness);
    std::make_shared<CTransaction_const,CMutableTransaction>
              ((CMutableTransaction *)&merkleRootofHashes);
    std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&((block.vtx.
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
               lVar7),(__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                      &merkleRootofHashes);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               (merkleRootofHashes.super_base_blob<256U>.m_data._M_elems + 8));
    CMutableTransaction::~CMutableTransaction((CMutableTransaction *)&blockWitness);
    lVar7 = lVar7 + 0x10;
  }
  BlockWitnessMerkleRoot(&blockWitness,&block,(bool *)0x0);
  hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<uint256,_std::allocator<uint256>_>::resize
            (&hashes,(long)block.vtx.
                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)block.vtx.
                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4);
  base_blob<256U>::SetNull
            (&(hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start)->super_base_blob<256U>);
  peVar2 = block.vtx.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar3 = *(undefined8 *)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar4 = *(undefined8 *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar5 = *(undefined8 *)
           ((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  *(undefined8 *)
   (hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_start[1].super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  *(undefined8 *)
   (hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_start[1].super_base_blob<256U>.m_data._M_elems + 0x18) = uVar5;
  *(undefined8 *)
   hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
   _M_start[1].super_base_blob<256U>.m_data._M_elems = uVar3;
  *(undefined8 *)
   (hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_start[1].super_base_blob<256U>.m_data._M_elems + 8) = uVar4;
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)&local_130,&hashes);
  hashes_00.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_fffffffffffffe80;
  hashes_00.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_fffffffffffffe78;
  hashes_00.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffffe88;
  ComputeMerkleRoot(&merkleRootofHashes,hashes_00,(bool *)&local_130);
  std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base(&local_130);
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp";
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x15e;
  file.m_begin = (iterator)&local_140;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_150,msg);
  local_168 = 0;
  local_170 = &PTR__lazy_ostream_011480b0;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&local_170,&stack0xfffffffffffffe80,0x15e,1,2,&merkleRootofHashes,"merkleRootofHashes",
             &blockWitness,"blockWitness");
  std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
            (&hashes.super__Vector_base<uint256,_std::allocator<uint256>_>);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&block.vtx);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(merkle_test_BlockWitness)
{
    CBlock block;

    block.vtx.resize(2);
    for (std::size_t pos = 0; pos < block.vtx.size(); pos++) {
        CMutableTransaction mtx;
        mtx.nLockTime = pos;
        block.vtx[pos] = MakeTransactionRef(std::move(mtx));
    }

    uint256 blockWitness = BlockWitnessMerkleRoot(block);

    std::vector<uint256> hashes;
    hashes.resize(block.vtx.size());
    hashes[0].SetNull();
    hashes[1] = block.vtx[1]->GetHash();

    uint256 merkleRootofHashes = ComputeMerkleRoot(hashes);

    BOOST_CHECK_EQUAL(merkleRootofHashes, blockWitness);
}